

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomx.cpp
# Opt level: O3

randomx_cache * randomx_alloc_cache(randomx_flags flags)

{
  randomx_cache *cache;
  JitCompilerX86 *pJVar1;
  uint8_t *puVar2;
  undefined *puVar3;
  size_type sVar4;
  char cVar5;
  size_t __n;
  long unaff_RBP;
  randomx_cache *__s;
  uint *puVar6;
  ulong uVar7;
  code *pcVar8;
  
  if ((flags & RANDOMX_FLAG_ARGON2_AVX2) != RANDOMX_FLAG_DEFAULT) {
    pcVar8 = randomx_argon2_impl_avx2();
LAB_0010b4d1:
    if ((Instruction)pcVar8 != (Instruction)0x0) goto LAB_0010b4dd;
    goto LAB_0010b622;
  }
  if ((flags & RANDOMX_FLAG_ARGON2_SSSE3) != RANDOMX_FLAG_DEFAULT) {
    pcVar8 = randomx_argon2_impl_ssse3();
    goto LAB_0010b4d1;
  }
  pcVar8 = randomx_argon2_fill_segment_ref;
LAB_0010b4dd:
  cache = (randomx_cache *)operator_new(0x83a8);
  puVar6 = (uint *)&(cache->cacheKey).field_2;
  __s = cache;
  memset(cache,0,0x83a0);
  (cache->cacheKey)._M_dataplus._M_p = (pointer)puVar6;
  (cache->cacheKey).field_2._M_local_buf[0] = '\0';
  cache->argonImpl = pcVar8;
  uVar7 = (ulong)(flags & (RANDOMX_FLAG_JIT|RANDOMX_FLAG_LARGE_PAGES));
  cVar5 = (char)((long)&switchD_0010b52d::switchdataD_00116b80 +
                (long)(int)(&switchD_0010b52d::switchdataD_00116b80)[uVar7]);
  switch(flags & (RANDOMX_FLAG_JIT|RANDOMX_FLAG_LARGE_PAGES)) {
  case RANDOMX_FLAG_DEFAULT:
    cache->dealloc = randomx::deallocCache<randomx::AlignedAllocator<64ul>>;
    cache->jit = (JitCompiler *)0x0;
    cache->initialize = randomx::initCache;
    pcVar8 = randomx::initDataset;
    goto LAB_0010b601;
  case RANDOMX_FLAG_LARGE_PAGES:
    cache->dealloc = randomx::deallocCache<randomx::LargePageAllocator>;
    cache->jit = (JitCompiler *)0x0;
    cache->initialize = randomx::initCache;
    pcVar8 = randomx::initDataset;
    goto LAB_0010b5b7;
  default:
    operator_delete(puVar6);
    if ((int)__n != 1) {
      _Unwind_Resume(&switchD_0010b52d::switchdataD_00116b80);
    }
    __cxa_begin_catch(&switchD_0010b52d::switchdataD_00116b80);
    if (cache != (randomx_cache *)0x0) {
      randomx_release_cache(cache);
    }
    __cxa_end_catch();
    goto LAB_0010b622;
  case RANDOMX_FLAG_JIT:
    cache->dealloc = randomx::deallocCache<randomx::AlignedAllocator<64ul>>;
    pJVar1 = (JitCompilerX86 *)operator_new(0x48);
    randomx::JitCompilerX86::JitCompilerX86(pJVar1);
    cache->jit = pJVar1;
    cache->initialize = randomx::initCacheCompile;
    pcVar8 = (code *)pJVar1->code;
LAB_0010b601:
    cache->datasetInit = pcVar8;
    puVar2 = (uint8_t *)randomx::AlignedAllocator<64UL>::allocMemory(0x10000000);
LAB_0010b612:
    cache->memory = puVar2;
    if (puVar2 == (uint8_t *)0x0) {
      randomx_release_cache(cache);
LAB_0010b622:
      cache = (randomx_cache *)0x0;
    }
    return cache;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_LARGE_PAGES:
    cache->dealloc = randomx::deallocCache<randomx::LargePageAllocator>;
    pJVar1 = (JitCompilerX86 *)operator_new(0x48);
    randomx::JitCompilerX86::JitCompilerX86(pJVar1);
    cache->jit = pJVar1;
    cache->initialize = randomx::initCacheCompile;
    pcVar8 = (code *)pJVar1->code;
LAB_0010b5b7:
    cache->datasetInit = pcVar8;
    puVar2 = (uint8_t *)randomx::LargePageAllocator::allocMemory(0x10000000);
    goto LAB_0010b612;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_HARD_AES:
    if ((ulong)((long)&switchD_0010b52d::switchdataD_00116b80 +
               (long)(int)(&switchD_0010b52d::switchdataD_00116b80)[uVar7]) < 2) {
      return (randomx_cache *)(ulong)*(uint *)&__s->memory;
    }
    memset(__s,0,__n);
    cache[1].programs[0].programBuffer[0x179] = (Instruction)pcVar8;
    cache[1].programs[0].programBuffer[0x17b].opcode = '\0';
    puVar3 = &randomx::InterpretedLightVm<randomx::AlignedAllocator<64ul>,true>::vtable;
    break;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_HARD_AES|RANDOMX_FLAG_LARGE_PAGES:
    std::thread::
    _State_impl<std::thread::_Invoker<std::tuple<void(*)(randomx_vm*,std::atomic<unsigned_int>&,AtomicHash&,unsigned_int,int,int),randomx_vm*,std::reference_wrapper<std::atomic<unsigned_int>>,std::reference_wrapper<AtomicHash>,int,unsigned_int,int>>>
    ::typeinfo_name[0x57] = cVar5 + 's';
    halt_baddata();
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM:
    switchD_0010b52d::switchdataD_00116b80._0_1_ = 0x2f;
    puVar6 = &switchD_0010b52d::switchdataD_00116b80;
    memset(&switchD_0010b52d::switchdataD_00116b80,0,0xcc0);
    randomx::CompiledVm<randomx::LargePageAllocator,_true,_false>::CompiledVm
              ((CompiledVm<randomx::LargePageAllocator,_true,_false> *)
               &switchD_0010b52d::switchdataD_00116b80);
    puVar3 = &randomx::CompiledLightVm<randomx::LargePageAllocator,true,false>::vtable;
    break;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_LARGE_PAGES:
    *(char *)(unaff_RBP + 0x31) = *(char *)(unaff_RBP + 0x31) + -0x80;
    _UNK_00116b76 = 0xc0b0202;
    halt_baddata();
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_HARD_AES:
    switchD_0010b52d::switchdataD_00116b80._0_1_ = 0x2f;
    puVar6 = &switchD_0010b52d::switchdataD_00116b80;
    memset(&switchD_0010b52d::switchdataD_00116b80,0,0xcc0);
    randomx::CompiledVm<randomx::LargePageAllocator,_false,_false>::CompiledVm
              ((CompiledVm<randomx::LargePageAllocator,_false,_false> *)
               &switchD_0010b52d::switchdataD_00116b80);
    puVar3 = &randomx::CompiledLightVm<randomx::LargePageAllocator,false,false>::vtable;
    break;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_HARD_AES|RANDOMX_FLAG_LARGE_PAGES:
    std::thread::
    _State_impl<std::thread::_Invoker<std::tuple<void(*)(randomx_vm*,std::atomic<unsigned_int>&,AtomicHash&,unsigned_int,int,int),randomx_vm*,std::reference_wrapper<std::atomic<unsigned_int>>,std::reference_wrapper<AtomicHash>,int,unsigned_int,int>>>
    ::typeinfo_name[0x57] = cVar5 + 's';
    halt_baddata();
  }
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)&((randomx_cache *)puVar6)->memory)->_M_allocated_capacity = (size_type)(puVar3 + 0x10);
  sVar4 = ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&((randomx_cache *)puVar6)->memory)->_M_allocated_capacity;
  if (uVar7 != 0) {
    (**(code **)(sVar4 + 0x30))(puVar6,uVar7);
    std::__cxx11::string::_M_assign
              ((string *)(((randomx_cache *)puVar6)->programs[0].programBuffer + 0x17c));
    sVar4 = ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&((randomx_cache *)puVar6)->memory)->_M_allocated_capacity;
  }
  if (cache != (randomx_cache *)0x0) {
    (**(code **)(sVar4 + 0x28))(puVar6,cache);
    sVar4 = ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&((randomx_cache *)puVar6)->memory)->_M_allocated_capacity;
  }
  (**(code **)(sVar4 + 0x10))(puVar6);
  return (randomx_cache *)puVar6;
}

Assistant:

randomx_cache *randomx_alloc_cache(randomx_flags flags) {
		randomx_cache *cache = nullptr;
		auto impl = randomx::selectArgonImpl(flags);
		if (impl == nullptr) {
			return cache;
		}

		try {
			cache = new randomx_cache();
			cache->argonImpl = impl;
			switch ((int)(flags & (RANDOMX_FLAG_JIT | RANDOMX_FLAG_LARGE_PAGES))) {
				case RANDOMX_FLAG_DEFAULT:
					cache->dealloc = &randomx::deallocCache<randomx::DefaultAllocator>;
					cache->jit = nullptr;
					cache->initialize = &randomx::initCache;
					cache->datasetInit = &randomx::initDataset;
					cache->memory = (uint8_t*)randomx::DefaultAllocator::allocMemory(randomx::CacheSize);
					break;

				case RANDOMX_FLAG_JIT:
					cache->dealloc = &randomx::deallocCache<randomx::DefaultAllocator>;
					cache->jit = new randomx::JitCompiler();
					cache->initialize = &randomx::initCacheCompile;
					cache->datasetInit = cache->jit->getDatasetInitFunc();
					cache->memory = (uint8_t*)randomx::DefaultAllocator::allocMemory(randomx::CacheSize);
					break;

				case RANDOMX_FLAG_LARGE_PAGES:
					cache->dealloc = &randomx::deallocCache<randomx::LargePageAllocator>;
					cache->jit = nullptr;
					cache->initialize = &randomx::initCache;
					cache->datasetInit = &randomx::initDataset;
					cache->memory = (uint8_t*)randomx::LargePageAllocator::allocMemory(randomx::CacheSize);
					break;

				case RANDOMX_FLAG_JIT | RANDOMX_FLAG_LARGE_PAGES:
					cache->dealloc = &randomx::deallocCache<randomx::LargePageAllocator>;
					cache->jit = new randomx::JitCompiler();
					cache->initialize = &randomx::initCacheCompile;
					cache->datasetInit = cache->jit->getDatasetInitFunc();
					cache->memory = (uint8_t*)randomx::LargePageAllocator::allocMemory(randomx::CacheSize);
					break;

				default:
					UNREACHABLE;
			}
		}
		catch (std::exception &ex) {
			if (cache != nullptr) {
				randomx_release_cache(cache);
				cache = nullptr;
			}
		}
		if (cache && cache->memory == nullptr) {
			randomx_release_cache(cache);
			cache = nullptr;
		}

		return cache;
	}